

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_panel_has_header(nk_flags flags,char *title)

{
  bool local_1e;
  int active;
  char *title_local;
  nk_flags flags_local;
  
  local_1e = false;
  if (((flags & 0x18) != 0 || (flags & 0x40) != 0) && (local_1e = false, (flags & 0x2000) == 0)) {
    local_1e = title != (char *)0x0;
  }
  return (uint)local_1e;
}

Assistant:

NK_LIB int
nk_panel_has_header(nk_flags flags, const char *title)
{
    int active = 0;
    active = (flags & (NK_WINDOW_CLOSABLE|NK_WINDOW_MINIMIZABLE));
    active = active || (flags & NK_WINDOW_TITLE);
    active = active && !(flags & NK_WINDOW_HIDDEN) && title;
    return active;
}